

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::image_type_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id)

{
  uint uVar1;
  Dim DVar2;
  Variant *pVVar3;
  size_t sVar4;
  bool bVar5;
  byte bVar6;
  uint32_t uVar7;
  ulong uVar8;
  SPIRVariable *pSVar9;
  runtime_error *prVar10;
  SPIRType *pSVar11;
  SPIRType *pSVar12;
  _Alloc_hider _Var13;
  uint32_t array_size;
  SPIRType img_type_4;
  char (*in_stack_fffffffffffffe58) [2];
  _Alloc_hider local_1a0;
  size_type local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined8 uStack_188;
  undefined1 local_180 [20];
  uint32_t local_16c;
  uint *local_160;
  size_t local_158;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  bool local_110 [24];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  uVar8 = (ulong)id;
  if ((uVar8 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar8].type == TypeVariable)) {
    pSVar9 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar8);
    uVar7 = (pSVar9->basevariable).id;
    if (uVar7 != 0) {
      id = uVar7;
    }
  }
  sVar4 = (type->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar4 != 0) {
    uVar1 = (this->msl_options).msl_version;
    if ((this->msl_options).platform == iOS) {
      if (uVar1 < 0x27d8) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_180._0_8_ = local_180 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,"MSL 1.2 or greater is required for arrays of textures.","");
        ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
        *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else if (uVar1 < 20000) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"MSL 2.0 or greater is required for arrays of textures.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
      *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (sVar4 != 1) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Arrays of arrays of textures are not supported in MSL.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
      *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1a0._M_p._0_4_ = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
    if ((uint32_t)local_1a0._M_p == 0) {
      uVar7 = get_resource_array_size(this,id);
      local_1a0._M_p._0_4_ = uVar7;
      if (uVar7 == 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_180._0_8_ = local_180 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,"Unsized array of images is not supported in MSL.","");
        ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
        *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pSVar11 = Compiler::get_pointee_type((Compiler *)this,type);
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (pSVar11->parent_type).id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
              ((char (*) [7])local_180,this,pSVar11,(ulong)id);
    join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x369148,(char (*) [7])local_180,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x376a17,
               (char (*) [3])&local_1a0,(uint *)0x368db5,in_stack_fffffffffffffe58);
    _Var13._M_p = (pointer)local_180._0_8_;
    if ((undefined1 *)local_180._0_8_ == local_180 + 0x10) {
      return __return_storage_ptr__;
    }
    goto LAB_002e691f;
  }
  local_198 = 0;
  local_190 = 0;
  local_1a0._M_p = &local_190;
  pSVar11 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (type->super_IVariant).self.id);
  bVar5 = Compiler::is_depth_image((Compiler *)this,type,id);
  DVar2 = (pSVar11->image).dim;
  if (bVar5) {
    switch(DVar2) {
    case Dim1D:
      if ((this->msl_options).texture_1D_as_2D == true) goto switchD_002e6821_caseD_1;
      break;
    case Dim2D:
switchD_002e6821_caseD_1:
      if ((((pSVar11->image).ms == true) && ((pSVar11->image).arrayed != false)) &&
         ((this->msl_options).msl_version < 0x4e84)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_180._0_8_ = local_180 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,"Multisampled array textures are supported from 2.1.","");
        ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
        *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      break;
    case Dim3D:
      break;
    case DimCube:
    }
    goto LAB_002e6c0c;
  }
  switch(DVar2) {
  case Dim1D:
    if ((this->msl_options).texture_1D_as_2D != false) goto switchD_002e6940_caseD_1;
    goto LAB_002e6bf3;
  case Dim2D:
switchD_002e6940_caseD_1:
    bVar6 = 0;
    goto LAB_002e69c7;
  case Dim3D:
    break;
  case DimCube:
    break;
  default:
    break;
  case DimBuffer:
    if (((pSVar11->image).ms != false) || ((pSVar11->image).arrayed == true)) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Cannot use texel buffers with multisampling or array layers.",
                 "");
      ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
      *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->msl_options).texture_buffer_native != true) break;
    if ((this->msl_options).msl_version < 0x4e84) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Native texture_buffer type is only supported in MSL 2.1.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
      *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::operator=((string *)&local_1a0,"texture_buffer");
    goto LAB_002e6c16;
  case DimSubpassData:
    bVar6 = 1;
    if ((this->msl_options).multiview == false) {
      bVar6 = (this->msl_options).arrayed_subpass_input;
    }
LAB_002e69c7:
    if (((*(int *)&(type->super_IVariant).field_0xc == 0x10) &&
        ((type->image).dim == DimSubpassData)) &&
       ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (pSVar11->image).type.id);
      SPIRType::SPIRType((SPIRType *)local_180,pSVar11);
      local_16c = 4;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (__return_storage_ptr__,this,local_180,0);
      local_180._0_8_ = &PTR__SPIRType_003f9270;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      local_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      local_120 = 0;
      if (local_128 != local_110) {
        free(local_128);
      }
      local_158 = 0;
      if (local_160 != local_148) {
        free(local_160);
      }
      _Var13._M_p = local_1a0._M_p;
      if (local_1a0._M_p == &local_190) {
        return __return_storage_ptr__;
      }
LAB_002e691f:
      operator_delete(_Var13._M_p);
      return __return_storage_ptr__;
    }
    if ((((pSVar11->image).ms == true) && (((bVar6 | (pSVar11->image).arrayed) & 1) != 0)) &&
       ((this->msl_options).msl_version < 0x4e84)) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Multisampled array textures are supported from 2.1.","");
      ::std::runtime_error::runtime_error(prVar10,(string *)local_180);
      *(undefined ***)prVar10 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_002e6bf3:
    ::std::__cxx11::string::append((char *)&local_1a0);
    goto LAB_002e6c16;
  }
LAB_002e6c0c:
  ::std::__cxx11::string::append((char *)&local_1a0);
LAB_002e6c16:
  ::std::__cxx11::string::append((char *)&local_1a0);
  pSVar12 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (pSVar11->image).type.id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_180,this,pSVar12,0);
  ::std::__cxx11::string::_M_append((char *)&local_1a0,local_180._0_8_);
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_);
  }
  if (((*(int *)&(type->super_IVariant).field_0xc == 0x10) && ((type->image).sampled == 2)) &&
     ((type->image).dim != DimSubpassData)) {
    if ((pSVar11->image).access < (AccessQualifierReadWrite|AccessQualifierWriteOnly)) {
      ::std::__cxx11::string::append((char *)&local_1a0);
    }
    else {
      pSVar9 = Compiler::maybe_get_backing_variable((Compiler *)this,id);
      if (pSVar9 != (SPIRVariable *)0x0) {
        uVar8 = (ulong)(pSVar9->basevariable).id;
        if (uVar8 != 0) {
          if (((this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size <= uVar8) ||
             (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr,
             pVVar3[uVar8].type != TypeVariable)) goto LAB_002e6d6d;
          pSVar9 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar8);
        }
        bVar5 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,
                           DecorationNonWritable);
        if (!bVar5) {
          ::std::__cxx11::string::append((char *)&local_1a0);
          bVar5 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,
                             DecorationNonReadable);
          if (!bVar5) {
            ::std::__cxx11::string::append((char *)&local_1a0);
          }
          ::std::__cxx11::string::append((char *)&local_1a0);
        }
      }
    }
  }
LAB_002e6d6d:
  ::std::__cxx11::string::append((char *)&local_1a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1a0._M_p == &local_190) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_18f,local_190);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_188;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1a0._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_18f,local_190);
  }
  __return_storage_ptr__->_M_string_length = local_198;
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::image_type_glsl(const SPIRType &type, uint32_t id)
{
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
	{
		// For comparison images, check against the base variable,
		// and not the fake ID which might have been generated for this variable.
		id = var->basevariable;
	}

	if (!type.array.empty())
	{
		uint32_t major = 2, minor = 0;
		if (msl_options.is_ios())
		{
			major = 1;
			minor = 2;
		}
		if (!msl_options.supports_msl_version(major, minor))
		{
			if (msl_options.is_ios())
				SPIRV_CROSS_THROW("MSL 1.2 or greater is required for arrays of textures.");
			else
				SPIRV_CROSS_THROW("MSL 2.0 or greater is required for arrays of textures.");
		}

		if (type.array.size() > 1)
			SPIRV_CROSS_THROW("Arrays of arrays of textures are not supported in MSL.");

		// Arrays of images in MSL must be declared with a special array<T, N> syntax ala C++11 std::array.
		// If we have a runtime array, it could be a variable-count descriptor set binding.
		uint32_t array_size = to_array_size_literal(type);
		if (array_size == 0)
			array_size = get_resource_array_size(id);

		if (array_size == 0)
			SPIRV_CROSS_THROW("Unsized array of images is not supported in MSL.");

		auto &parent = get<SPIRType>(get_pointee_type(type).parent_type);
		return join("array<", image_type_glsl(parent, id), ", ", array_size, ">");
	}

	string img_type_name;

	// Bypass pointers because we need the real image struct
	auto &img_type = get<SPIRType>(type.self).image;
	if (is_depth_image(type, id))
	{
		switch (img_type.dim)
		{
		case Dim1D:
		case Dim2D:
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += "depth1d_unsupported_by_metal";
				break;
			}

			if (img_type.ms && img_type.arrayed)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "depth2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "depth2d_ms";
			else if (img_type.arrayed)
				img_type_name += "depth2d_array";
			else
				img_type_name += "depth2d";
			break;
		case Dim3D:
			img_type_name += "depth3d_unsupported_by_metal";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "depthcube_array" : "depthcube");
			else
				img_type_name += (img_type.arrayed ? "depth2d_array" : "depthcube");
			break;
		default:
			img_type_name += "unknown_depth_texture_type";
			break;
		}
	}
	else
	{
		switch (img_type.dim)
		{
		case DimBuffer:
			if (img_type.ms || img_type.arrayed)
				SPIRV_CROSS_THROW("Cannot use texel buffers with multisampling or array layers.");

			if (msl_options.texture_buffer_native)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Native texture_buffer type is only supported in MSL 2.1.");
				img_type_name = "texture_buffer";
			}
			else
				img_type_name += "texture2d";
			break;
		case Dim1D:
		case Dim2D:
		case DimSubpassData:
		{
			bool subpass_array =
			    img_type.dim == DimSubpassData && (msl_options.multiview || msl_options.arrayed_subpass_input);
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += (img_type.arrayed ? "texture1d_array" : "texture1d");
				break;
			}

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			if (type_is_msl_framebuffer_fetch(type))
			{
				auto img_type_4 = get<SPIRType>(img_type.type);
				img_type_4.vecsize = 4;
				return type_to_glsl(img_type_4);
			}
			if (img_type.ms && (img_type.arrayed || subpass_array))
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "texture2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "texture2d_ms";
			else if (img_type.arrayed || subpass_array)
				img_type_name += "texture2d_array";
			else
				img_type_name += "texture2d";
			break;
		}
		case Dim3D:
			img_type_name += "texture3d";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "texturecube_array" : "texturecube");
			else
				img_type_name += (img_type.arrayed ? "texture2d_array" : "texturecube");
			break;
		default:
			img_type_name += "unknown_texture_type";
			break;
		}
	}

	// Append the pixel type
	img_type_name += "<";
	img_type_name += type_to_glsl(get<SPIRType>(img_type.type));

	// For unsampled images, append the sample/read/write access qualifier.
	// For kernel images, the access qualifier my be supplied directly by SPIR-V.
	// Otherwise it may be set based on whether the image is read from or written to within the shader.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2 && type.image.dim != DimSubpassData)
	{
		switch (img_type.access)
		{
		case AccessQualifierReadOnly:
			img_type_name += ", access::read";
			break;

		case AccessQualifierWriteOnly:
			img_type_name += ", access::write";
			break;

		case AccessQualifierReadWrite:
			img_type_name += ", access::read_write";
			break;

		default:
		{
			auto *p_var = maybe_get_backing_variable(id);
			if (p_var && p_var->basevariable)
				p_var = maybe_get<SPIRVariable>(p_var->basevariable);
			if (p_var && !has_decoration(p_var->self, DecorationNonWritable))
			{
				img_type_name += ", access::";

				if (!has_decoration(p_var->self, DecorationNonReadable))
					img_type_name += "read_";

				img_type_name += "write";
			}
			break;
		}
		}
	}

	img_type_name += ">";

	return img_type_name;
}